

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

int __thiscall llama_context::decode(llama_context *this,llama_batch *inp_batch)

{
  uint uVar1;
  _Manager_type p_Var2;
  llama_batch in_batch;
  bool bVar3;
  llama_pos lVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int32_t iVar7;
  int iVar8;
  value_type vVar9;
  pointer plVar10;
  runtime_error *this_00;
  pointer ppgVar11;
  uint *puVar12;
  pointer pgVar13;
  pointer plVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar15;
  long lVar16;
  size_type sVar17;
  size_type *psVar18;
  reference pvVar19;
  float *pfVar20;
  int *in_RSI;
  llama_kv_cache_unified *in_RDI;
  float fVar21;
  float fragmentation;
  int64_t out_id;
  int64_t i_3;
  bool sorted_output;
  llama_seq_id seq_id_1;
  uint32_t s_1;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *embd_seq_out_1;
  llama_seq_id seq_id;
  uint32_t s;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *embd_seq_out;
  float *embd_out;
  ggml_backend_t backend_embd;
  float *logits_out;
  ggml_backend_t backend_res;
  ggml_tensor *t_embd;
  ggml_tensor *t_logits;
  ggml_status compute_status;
  llm_graph_result_ptr res;
  ggml_cgraph *gf;
  uint32_t pad;
  uint32_t i_2;
  int32_t n_outputs_new;
  uint32_t *n_ubatch;
  llama_ubatch ubatch;
  int64_t n_outputs_prev;
  bool logits_all;
  uint32_t i_1;
  int64_t n_outputs_all;
  bool embd_pooled;
  int64_t i;
  llama_kv_cache_guard kv_guard;
  int64_t n_embd;
  int64_t n_tokens_all;
  int32_t n_vocab;
  llama_hparams *hparams;
  llama_vocab *vocab;
  llama_batch *batch;
  llama_batch_allocr batch_allocr;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *this_01;
  llama_batch_allocr *this_02;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  llama_kv_cache_unified *in_stack_fffffffffffffb60;
  vector<float,_std::allocator<float>_> *this_03;
  size_t n_ubatch_00;
  llama_sbatch *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  llama_sbatch *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  undefined4 in_stack_fffffffffffffb98;
  llama_pos in_stack_fffffffffffffb9c;
  llama_context *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  llama_context *plVar26;
  undefined8 in_stack_fffffffffffffbd0;
  llama_context *plVar27;
  undefined6 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbde;
  undefined1 in_stack_fffffffffffffbdf;
  int8_t *in_stack_fffffffffffffbe0;
  llama_batch *in_stack_fffffffffffffbe8;
  llama_sbatch *in_stack_fffffffffffffbf0;
  llama_context *in_stack_fffffffffffffbf8;
  llama_context *in_stack_fffffffffffffc00;
  llama_context *in_stack_fffffffffffffc08;
  ggml_context *in_stack_fffffffffffffc10;
  llama_context *in_stack_fffffffffffffc18;
  long local_3d0;
  bool local_361;
  int iVar28;
  float local_32c;
  float local_328;
  float local_324;
  size_type local_320;
  size_type local_318;
  byte local_309;
  _Self local_308;
  _Self local_300;
  int local_2f8;
  uint local_2f4;
  bool *local_2f0;
  _Self local_2e8;
  _Self local_2e0;
  int local_2d8;
  uint local_2d4;
  bool *local_2d0;
  _Invoker_type local_2c8;
  llama_context *local_2c0;
  long local_2b8;
  llama_context *local_2b0;
  llama_context *local_2a8;
  long local_2a0;
  ggml_status local_294;
  ggml_cgraph *local_288;
  uint local_280;
  uint32_t local_27c;
  uint local_278;
  uint local_274;
  undefined1 local_270 [64];
  undefined1 local_230 [64];
  undefined1 local_1f0 [64];
  pointer *local_1b0;
  undefined1 local_1a8 [4];
  uint local_1a4;
  uint local_19c;
  long local_178;
  long local_170;
  long local_168;
  int local_15c;
  undefined1 local_155;
  uint local_154;
  size_type local_150;
  bool local_141;
  long local_140;
  llama_kv_cache_guard local_138;
  ulong local_130;
  size_type local_128;
  uint32_t local_10c;
  _func_int **local_108;
  _func_int **local_100;
  int *local_f8;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *local_f0;
  llama_batch_allocr *plStack_e8;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  size_type local_d0;
  vector<float,_std::allocator<float>_> *pvStack_c8;
  size_t local_c0;
  int local_b8 [40];
  int *local_18;
  int local_4;
  
  if (*in_RSI == 0) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: n_tokens == 0\n","decode");
    local_4 = -1;
  }
  else {
    local_18 = in_RSI;
    memcpy(&local_f0,in_RSI,0x38);
    if (*(long *)(local_18 + 6) == 0) {
      std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
      operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *
                 )0x3dd579);
      lVar4 = llama_kv_cache_unified::pos_max(in_stack_fffffffffffffb60);
      iVar28 = lVar4 + 1;
    }
    else {
      iVar28 = -1;
    }
    in_batch.token = (llama_token *)in_stack_fffffffffffffbb8;
    in_batch._0_8_ = in_stack_fffffffffffffbb0;
    in_batch.embd = (float *)in_stack_fffffffffffffbc0;
    in_batch.pos = (llama_pos *)in_stack_fffffffffffffbc8;
    in_batch.n_seq_id = (int32_t *)in_stack_fffffffffffffbd0;
    in_batch.seq_id._0_6_ = in_stack_fffffffffffffbd8;
    in_batch.seq_id._6_1_ = in_stack_fffffffffffffbde;
    in_batch.seq_id._7_1_ = in_stack_fffffffffffffbdf;
    in_batch.logits = in_stack_fffffffffffffbe0;
    llama_batch_allocr::llama_batch_allocr
              ((llama_batch_allocr *)in_stack_fffffffffffffba0,in_batch,in_stack_fffffffffffffb9c);
    local_100 = (in_RDI->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i + 0x32b;
    local_108 = (in_RDI->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i + 5;
    local_f8 = local_b8;
    uVar5 = llama_vocab::n_tokens((llama_vocab *)0x3dd61f);
    local_128 = (size_type)*local_f8;
    local_130 = (ulong)*(uint *)(local_108 + 1);
    local_10c = uVar5;
    plVar10 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ::get((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                     *)plStack_e8);
    llama_kv_cache_guard::llama_kv_cache_guard(&local_138,&plVar10->super_llama_kv_cache);
    if (((*(long *)(local_f8 + 2) != 0) || (*(long *)(local_f8 + 4) == 0)) &&
       ((*(long *)(local_f8 + 2) == 0 || (*(long *)(local_f8 + 4) != 0)))) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,0x4bb,"GGML_ASSERT(%s) failed",
                 "(!batch.token && batch.embd) || (batch.token && !batch.embd)");
    }
    this_01 = local_f0;
    this_02 = plStack_e8;
    uVar22 = local_e0;
    uVar23 = uStack_dc;
    uVar24 = uStack_d8;
    uVar25 = uStack_d4;
    sVar17 = local_d0;
    this_03 = pvStack_c8;
    n_ubatch_00 = local_c0;
    if (*(long *)(local_f8 + 2) != 0) {
      for (local_140 = 0; local_140 < (long)local_128; local_140 = local_140 + 1) {
        if ((*(int *)(*(long *)(local_f8 + 2) + local_140 * 4) < 0) ||
           (uVar1 = *(uint *)(*(long *)(local_f8 + 2) + local_140 * 4),
           uVar6 = llama_vocab::n_tokens((llama_vocab *)0x3dd797), uVar6 <= uVar1)) {
          llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: invalid token[%ld] = %d\n","decode",local_140
                             ,(ulong)*(uint *)(*(long *)(local_f8 + 2) + local_140 * 4));
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"invalid token");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    if ((long)(ulong)*(uint *)((long)&(in_RDI->defrag_info).ids.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 4) <
        (long)local_128) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,0x4c6,"GGML_ASSERT(%s) failed","n_tokens_all <= cparams.n_batch");
    }
    if ((((in_RDI->cbs).get_rope_factors.super__Function_base._M_functor._M_pod_data[1] & 1U) == 0)
       && ((long)(ulong)*(uint *)&(in_RDI->defrag_info).ids.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish < (long)local_128)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,0x4c8,"GGML_ASSERT(%s) failed",
                 "(cparams.causal_attn || cparams.n_ubatch >= n_tokens_all) && \"non-causal attention requires n_ubatch >= n_tokens\""
                );
    }
    if (in_RDI[3].k_l.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      ppgVar11 = (pointer)ggml_time_us();
      in_RDI[3].k_l.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppgVar11;
    }
    in_RDI[3].k_l.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(local_128 +
                  (long)in_RDI[3].k_l.
                        super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    local_361 = false;
    if (((in_RDI->cbs).get_rope_factors.super__Function_base._M_functor._M_pod_data[0] & 1U) != 0) {
      local_361 = *(int *)((long)&(in_RDI->cbs).get_rope_factors.super__Function_base._M_functor + 8
                          ) != 0;
    }
    local_141 = local_361;
    std::
    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::clear((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
             *)0x3dd993);
    local_150 = 0;
    if ((*(long *)(local_f8 + 0xc) == 0) || ((local_141 & 1U) != 0)) {
      if ((((ulong)in_RDI[2].hparams & 1) == 0) && ((local_141 & 1U) == 0)) {
        local_150 = 1;
      }
      else {
        local_150 = local_128;
      }
    }
    else {
      for (local_154 = 0; (long)(ulong)local_154 < (long)local_128; local_154 = local_154 + 1) {
        local_150 = (*(char *)(*(long *)(local_f8 + 0xc) + (ulong)local_154) != '\0') + local_150;
      }
    }
    local_155 = local_150 == local_128;
    std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
    operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *)
               0x3ddab6);
    llama_sbatch::from_batch
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,(size_t)in_stack_fffffffffffffbe0
               ,(bool)in_stack_fffffffffffffbdf,(bool)in_stack_fffffffffffffbde);
    iVar7 = output_reserve(in_stack_fffffffffffffbf8,
                           (int32_t)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
    if ((long)local_150 <= (long)iVar7) {
      kv_self_update(in_stack_fffffffffffffc00);
      local_168 = 0;
LAB_003ddb77:
      if ((in_RDI->bufs).
          super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        llama_kv_cache_guard::commit((llama_kv_cache_guard *)0x3de99d);
        local_309 = 1;
        sVar17 = std::vector<long,_std::allocator<long>_>::size
                           ((vector<long,_std::allocator<long>_> *)&in_RDI[1].pending);
        if (sVar17 != local_150) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                     ,0x59e,"GGML_ASSERT(%s) failed",
                     "sbatch.out_ids.size() == (size_t) n_outputs_all");
        }
        for (local_318 = 0; (long)local_318 < (long)local_150; local_318 = local_318 + 1) {
          psVar18 = (size_type *)
                    std::vector<long,_std::allocator<long>_>::operator[]
                              ((vector<long,_std::allocator<long>_> *)&in_RDI[1].pending,local_318);
          local_320 = *psVar18;
          vVar9 = (value_type)local_318;
          pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &in_RDI[2].k_l.
                                super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish,local_320);
          *pvVar19 = vVar9;
          if (local_320 != local_318) {
            local_309 = 0;
          }
        }
        if ((local_309 & 1) != 0) {
          std::vector<long,_std::allocator<long>_>::clear
                    ((vector<long,_std::allocator<long>_> *)0x3deabe);
        }
        *(int *)&in_RDI[2].k_l.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                 _M_impl.super__Vector_impl_data._M_start = (int)local_150;
        if ((((in_RDI->cbs).get_rope_factors.super__Function_base._M_functor._M_pod_data[1] & 1U) !=
             0) && (0.0 < *(float *)((long)&in_RDI->hparams + 4))) {
          plVar10 = std::
                    unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                    ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                  *)0x3deb0b);
          if (plVar10->n < 0x800) {
            local_324 = 0.0;
          }
          else {
            local_328 = 0.0;
            plVar10 = std::
                      unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                      ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                    *)0x3deb3c);
            uVar5 = plVar10->used;
            plVar10 = std::
                      unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                      ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                    *)0x3deb4d);
            uVar6 = llama_kv_cache_unified::get_padding
                              (plVar10,(llama_cparams *)&in_RDI->defrag_info);
            fVar21 = (float)(uVar5 + uVar6);
            plVar10 = std::
                      unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                      ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                    *)0x3deb90);
            local_32c = 1.0 - fVar21 / (float)plVar10->n;
            pfVar20 = std::max<float>(&local_328,&local_32c);
            local_324 = *pfVar20;
          }
          pfVar20 = (float *)((long)&in_RDI->hparams + 4);
          if (*pfVar20 <= local_324 && local_324 != *pfVar20) {
            llama_log_internal(SUB84((double)local_324,0),(char *)0x1,
                               "%s: fragmentation: %.2f - requesting defrag\n","decode");
            plVar10 = std::
                      unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                      ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                    *)0x3dec52);
            (*(plVar10->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i[1])();
          }
        }
        pgVar13 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                            ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)this_02);
        ggml_backend_sched_reset(pgVar13);
        local_4 = 0;
        local_15c = 1;
      }
      else {
        memset(local_1a8,0,0x40);
        local_1b0 = &(in_RDI->defrag_info).ids.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        plVar10 = std::
                  unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
                  operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                              *)0x3ddbc8);
        if ((plVar10->recurrent & 1U) == 0) {
          llama_sbatch::split_simple(in_stack_fffffffffffffb70,n_ubatch_00);
          memcpy(local_1a8,local_270,0x40);
        }
        else if ((local_141 & 1U) == 0) {
          llama_sbatch::split_equal
                    (in_stack_fffffffffffffb80,
                     CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
          memcpy(local_1a8,local_230,0x40);
        }
        else {
          llama_sbatch::split_seq
                    (in_stack_fffffffffffffb80,
                     CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
          memcpy(local_1a8,local_1f0,0x40);
        }
        local_274 = 0;
        if (local_150 == local_128) {
          local_274 = local_1a4;
        }
        else {
          if (local_170 == 0) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                       ,0x50c,"GGML_ASSERT(%s) failed","ubatch.output");
          }
          for (local_278 = 0; local_278 < local_1a4; local_278 = local_278 + 1) {
            local_274 = (*(char *)(local_170 + (ulong)local_278) != '\0') + local_274;
          }
        }
        *(uint *)&in_RDI[2].k_l.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                  _M_impl.super__Vector_impl_data._M_start = local_274;
        std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
        operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                    *)0x3ddd7f);
        bVar3 = llama_kv_cache_unified::find_slot(in_RDI,(llama_ubatch *)CONCAT44(iVar28,uVar5));
        if (bVar3) goto LAB_003ddde3;
        llama_log_internal(GGML_LOG_LEVEL_WARN,
                           "%s: failed to find KV cache slot for ubatch of size %d\n","decode",
                           (ulong)local_1a4);
        local_4 = 1;
        local_15c = 1;
      }
      goto LAB_003dec98;
    }
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: could not reserve space for batch with %ld outputs\n","decode",local_150
                      );
    local_4 = -2;
    local_15c = 1;
LAB_003dec98:
    llama_kv_cache_guard::~llama_kv_cache_guard((llama_kv_cache_guard *)0x3deca5);
    llama_batch_allocr::~llama_batch_allocr(this_02);
  }
  return local_4;
LAB_003ddde3:
  plVar10 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
            operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                        *)0x3dddf7);
  if ((plVar10->recurrent & 1U) == 0) {
    plVar10 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                            *)0x3dde15);
    local_27c = llama_kv_cache_unified::get_padding(plVar10,(llama_cparams *)&in_RDI->defrag_info);
    plVar10 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                            *)0x3dde5c);
    std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
    operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *)
               0x3dde75);
    uVar6 = llama_kv_cache_unified::cell_max((llama_kv_cache_unified *)CONCAT44(uVar23,uVar22));
    local_280 = (uVar6 - 1) + local_27c & -local_27c;
    puVar12 = std::max<unsigned_int>(&local_27c,&local_280);
    puVar12 = std::min<unsigned_int>(&plVar10->size,puVar12);
    uVar1 = *puVar12;
    plVar10 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                            *)0x3ddf0a);
    plVar10->n = uVar1;
  }
  pgVar13 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                      ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)this_02);
  ggml_backend_sched_reset(pgVar13);
  pgVar13 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                      ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)this_02);
  ggml_backend_sched_set_eval_callback
            (pgVar13,(in_RDI->cbs).get_rope_factors.super__Function_base._M_manager,
             (in_RDI->cbs).get_rope_factors._M_invoker);
  local_288 = graph_init((llama_context *)
                         CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  std::unique_ptr<ggml_context,_ggml_context_deleter>::get
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)this_02);
  graph_build(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
              (ggml_cgraph *)in_stack_fffffffffffffc08,(llama_ubatch *)in_stack_fffffffffffffc00,
              (llm_graph_type)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
  pgVar13 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                      ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)this_02);
  ggml_backend_sched_alloc_graph(pgVar13,local_288);
  plVar14 = std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::
            operator->((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_> *)
                       0x3ddffe);
  (*plVar14->_vptr_llm_graph_result_i[5])(plVar14,local_1a8);
  local_294 = graph_compute(in_stack_fffffffffffffba0,
                            (ggml_cgraph *)
                            CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                            SUB41((uint)in_stack_fffffffffffffb94 >> 0x18,0));
  if (local_294 == GGML_STATUS_SUCCESS) {
    if (((in_RDI->cbs).get_rope_factors.super__Function_base._M_functor._M_pod_data[0] & 1U) == 0) {
      plVar14 = std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::
                operator->((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>
                            *)0x3de12f);
      iVar8 = (*plVar14->_vptr_llm_graph_result_i[2])();
      local_3d0 = CONCAT44(extraout_var,iVar8);
    }
    else {
      local_3d0 = 0;
    }
    local_2a0 = local_3d0;
    if (((in_RDI->cbs).get_rope_factors.super__Function_base._M_functor._M_pod_data[0] & 1U) == 0) {
      in_stack_fffffffffffffc18 = (llama_context *)0x0;
    }
    else {
      plVar14 = std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::
                operator->((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>
                            *)0x3de182);
      iVar8 = (*plVar14->_vptr_llm_graph_result_i[3])();
      in_stack_fffffffffffffc18 = (llama_context *)CONCAT44(extraout_var_00,iVar8);
    }
    local_2a8 = in_stack_fffffffffffffc18;
    if (in_stack_fffffffffffffc18 != (llama_context *)0x0) {
      plVar14 = std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::
                operator->((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>
                            *)0x3de1de);
      iVar8 = (*plVar14->_vptr_llm_graph_result_i[4])();
      in_stack_fffffffffffffc10 = (ggml_context *)CONCAT44(extraout_var_01,iVar8);
      if (in_stack_fffffffffffffc10 != (ggml_context *)0x0) {
        plVar14 = std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::
                  operator->((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>
                              *)0x3de20f);
        iVar8 = (*plVar14->_vptr_llm_graph_result_i[4])();
        in_stack_fffffffffffffc08 = (llama_context *)CONCAT44(extraout_var_02,iVar8);
        local_2a8 = in_stack_fffffffffffffc08;
      }
    }
    if ((local_2a0 != 0) &&
       (0 < *(int *)&in_RDI[2].k_l.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start)) {
      pgVar13 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                          ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)this_02);
      in_stack_fffffffffffffc00 =
           (llama_context *)ggml_backend_sched_get_tensor_backend(pgVar13,local_2a0);
      local_2b0 = in_stack_fffffffffffffc00;
      if (in_stack_fffffffffffffc00 == (llama_context *)0x0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                   ,0x551,"GGML_ASSERT(%s) failed","backend_res != nullptr");
      }
      if (*(long *)((long)&in_RDI[2].cbs.get_rope_factors.super__Function_base._M_functor + 8) == 0)
      {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                   ,0x552,"GGML_ASSERT(%s) failed","logits != nullptr");
      }
      local_2b8 = *(long *)((long)&in_RDI[2].cbs.get_rope_factors.super__Function_base._M_functor +
                           8) + local_168 * (int)local_10c * 4;
      if (*(int *)&in_RDI[2].k_l.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                   _M_impl.super__Vector_impl_data._M_start != 0) {
        if ((long)local_150 <
            local_168 +
            *(int *)&in_RDI[2].k_l.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                     ,0x557,"GGML_ASSERT(%s) failed","n_outputs_prev + n_outputs <= n_outputs_all");
        }
        lVar15 = (local_168 +
                 *(int *)&in_RDI[2].k_l.
                          super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_start) * (long)(int)local_10c;
        lVar16 = *(long *)&in_RDI[2].cbs.get_rope_factors.super__Function_base._M_functor;
        if (lVar15 - lVar16 != 0 && lVar16 <= lVar15) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                     ,0x558,"GGML_ASSERT(%s) failed",
                     "(n_outputs_prev + n_outputs)*n_vocab <= (int64_t) logits_size");
        }
        ggml_backend_tensor_get_async
                  (in_stack_fffffffffffffc00,local_2a0,local_2b8,0,
                   (long)(int)(*(int *)&in_RDI[2].k_l.
                                        super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start * local_10c) << 2)
        ;
      }
    }
    if ((local_2a8 != (llama_context *)0x0) &&
       (0 < *(int *)&in_RDI[2].k_l.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start)) {
      pgVar13 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                          ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)this_02);
      in_stack_fffffffffffffbf8 = (llama_context *)ggml_backend_sched_get_tensor_backend(pgVar13);
      local_2c0 = in_stack_fffffffffffffbf8;
      if (in_stack_fffffffffffffbf8 == (llama_context *)0x0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                   ,0x560,"GGML_ASSERT(%s) failed","backend_embd != nullptr");
      }
      switch(*(undefined4 *)
              ((long)&(in_RDI->cbs).get_rope_factors.super__Function_base._M_functor + 8)) {
      case 0:
        if (in_RDI[2].cbs.get_rope_factors._M_invoker == (_Invoker_type)0x0) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                     ,0x566,"GGML_ASSERT(%s) failed","embd != nullptr");
        }
        local_2c8 = in_RDI[2].cbs.get_rope_factors._M_invoker + local_168 * local_130 * 4;
        if (*(int *)&in_RDI[2].k_l.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start != 0) {
          if ((long)local_150 <
              local_168 +
              *(int *)&in_RDI[2].k_l.
                       super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                       super__Vector_impl_data._M_start) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                       ,0x56a,"GGML_ASSERT(%s) failed","n_outputs_prev + n_outputs <= n_outputs_all"
                      );
          }
          lVar16 = (local_168 +
                   *(int *)&in_RDI[2].k_l.
                            super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) * local_130;
          p_Var2 = in_RDI[2].cbs.get_rope_factors.super__Function_base._M_manager;
          if (lVar16 - (long)p_Var2 != 0 && (long)p_Var2 <= lVar16) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                       ,0x56b,"GGML_ASSERT(%s) failed",
                       "(n_outputs_prev + n_outputs)*n_embd <= (int64_t) embd_size");
          }
          ggml_backend_tensor_get_async
                    (in_stack_fffffffffffffbf8,local_2a8,local_2c8,0,
                     (long)*(int *)&in_RDI[2].k_l.
                                    super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start * local_130 * 4);
        }
        break;
      case 1:
      case 2:
      case 3:
        local_2d0 = &in_RDI[2].has_shift;
        for (local_2d4 = 0; local_2d4 < local_19c; local_2d4 = local_2d4 + 1) {
          local_2d8 = **(int **)(local_178 + (ulong)local_2d4 * 8);
          local_2e0._M_node =
               (_Base_ptr)
               std::
               map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::find(this_01,(key_type *)0x3de696);
          local_2e8._M_node =
               (_Base_ptr)
               std::
               map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::end(this_01);
          bVar3 = std::operator!=(&local_2e0,&local_2e8);
          if (!bVar3) {
            std::
            map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
            ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                          *)in_stack_fffffffffffffb80,
                         (key_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
            std::vector<float,_std::allocator<float>_>::resize(this_03,sVar17);
            plVar26 = local_2c0;
            plVar27 = local_2a8;
            std::
            map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
            ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                          *)in_stack_fffffffffffffb80,
                         (key_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
            pfVar20 = std::vector<float,_std::allocator<float>_>::data
                                ((vector<float,_std::allocator<float>_> *)0x3de767);
            ggml_backend_tensor_get_async
                      (plVar26,plVar27,pfVar20,local_130 * (long)local_2d8 * 4,local_130 << 2);
          }
        }
        break;
      case 4:
        local_2f0 = &in_RDI[2].has_shift;
        for (local_2f4 = 0; local_2f4 < local_19c; local_2f4 = local_2f4 + 1) {
          local_2f8 = **(int **)(local_178 + (ulong)local_2f4 * 8);
          local_300._M_node =
               (_Base_ptr)
               std::
               map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::find(this_01,(key_type *)0x3de823);
          local_308._M_node =
               (_Base_ptr)
               std::
               map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::end(this_01);
          bVar3 = std::operator!=(&local_300,&local_308);
          if (!bVar3) {
            std::
            map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
            ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                          *)in_stack_fffffffffffffb80,
                         (key_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
            std::vector<float,_std::allocator<float>_>::resize(this_03,sVar17);
            plVar26 = local_2a8;
            in_stack_fffffffffffffba0 = local_2c0;
            std::
            map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
            ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                          *)in_stack_fffffffffffffb80,
                         (key_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
            pfVar20 = std::vector<float,_std::allocator<float>_>::data
                                ((vector<float,_std::allocator<float>_> *)0x3de8e5);
            ggml_backend_tensor_get_async
                      (in_stack_fffffffffffffba0,plVar26,pfVar20,(long)local_2f8 << 2,4);
          }
        }
        break;
      case 0xffffffff:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                   ,0x58f,"unknown pooling type");
      }
    }
    local_168 = *(int *)&in_RDI[2].k_l.
                         super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                         super__Vector_impl_data._M_start + local_168;
    local_15c = 0;
  }
  else if (local_294 == GGML_STATUS_ALLOC_FAILED) {
    local_4 = -2;
    local_15c = 1;
  }
  else if ((local_294 == GGML_STATUS_FAILED) || (local_294 != GGML_STATUS_ABORTED)) {
    local_4 = -3;
    local_15c = 1;
  }
  else {
    local_4 = 2;
    local_15c = 1;
  }
  std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::~unique_ptr
            ((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_> *)
             CONCAT44(uVar25,uVar24));
  if (local_15c != 0) goto LAB_003dec98;
  goto LAB_003ddb77;
}

Assistant:

int llama_context::decode(llama_batch & inp_batch) {
    if (inp_batch.n_tokens == 0) {
        LLAMA_LOG_ERROR("%s: n_tokens == 0\n", __func__);
        return -1;
    }

    // temporary allocate memory for the input batch if needed
    // TODO: this is incorrect for multiple sequences because pos_max() is the maximum across all sequences
    llama_batch_allocr batch_allocr(inp_batch, inp_batch.pos ? -1 : kv_self->pos_max() + 1);

    const llama_batch & batch = batch_allocr.batch;

    const auto & vocab   = model.vocab;
    const auto & hparams = model.hparams;

    const int32_t n_vocab = vocab.n_tokens();

    const int64_t n_tokens_all = batch.n_tokens;
    const int64_t n_embd       = hparams.n_embd;

    llama_kv_cache_guard kv_guard(kv_self.get());

    GGML_ASSERT((!batch.token && batch.embd) || (batch.token && !batch.embd)); // NOLINT

    if (batch.token) {
        for (int64_t i = 0; i < n_tokens_all; ++i) {
            if (batch.token[i] < 0 || (uint32_t) batch.token[i] >= model.vocab.n_tokens()) {
                LLAMA_LOG_ERROR("%s: invalid token[%" PRId64 "] = %d\n", __func__, i, batch.token[i]);
                throw std::runtime_error("invalid token");
            }
        }
    }

    GGML_ASSERT(n_tokens_all <= cparams.n_batch);

    GGML_ASSERT((cparams.causal_attn || cparams.n_ubatch >= n_tokens_all) && "non-causal attention requires n_ubatch >= n_tokens");

    if (t_compute_start_us == 0) {
        t_compute_start_us = ggml_time_us();
    }
    n_queued_tokens += n_tokens_all;

    // this indicates we are doing pooled embedding, so we ignore batch.logits and output all tokens
    const bool embd_pooled = cparams.embeddings && cparams.pooling_type != LLAMA_POOLING_TYPE_NONE;

    embd_seq.clear();

    int64_t n_outputs_all = 0;

    // count outputs
    if (batch.logits && !embd_pooled) {
        for (uint32_t i = 0; i < n_tokens_all; ++i) {
            n_outputs_all += batch.logits[i] != 0;
        }
    } else if (logits_all || embd_pooled) {
        n_outputs_all = n_tokens_all;
    } else {
        // keep last output only
        n_outputs_all = 1;
    }

    const bool logits_all = n_outputs_all == n_tokens_all;

    sbatch.from_batch(batch, n_embd,
            /* simple_split */ !kv_self->recurrent,
            /* logits_all   */ logits_all);

    // reserve output buffer
    if (output_reserve(n_outputs_all) < n_outputs_all) {
        LLAMA_LOG_ERROR("%s: could not reserve space for batch with %" PRId64 " outputs\n", __func__, n_outputs_all);
        return -2;
    };

    // handle any pending defrags/shifts
    kv_self_update();

    int64_t n_outputs_prev = 0;

    while (sbatch.n_tokens > 0) {
        llama_ubatch ubatch = llama_ubatch();

        const auto & n_ubatch = cparams.n_ubatch;

        if (kv_self->recurrent) {
            if (embd_pooled) {
                // Pooled embeddings cannot be split across ubatches (yet)
                ubatch = sbatch.split_seq(cparams.n_ubatch);
            } else {
                // recurrent model architectures are easier to implement
                // with equal-length sequences
                ubatch = sbatch.split_equal(cparams.n_ubatch);
            }
        } else {
            ubatch = sbatch.split_simple(n_ubatch);
        }

        // count the outputs in this u_batch
        {
            int32_t n_outputs_new = 0;

            if (n_outputs_all == n_tokens_all) {
                n_outputs_new = ubatch.n_tokens;
            } else {
                GGML_ASSERT(ubatch.output);
                for (uint32_t i = 0; i < ubatch.n_tokens; i++) {
                    n_outputs_new += (int32_t) (ubatch.output[i] != 0);
                }
            }

            // needs to happen before the graph is built
            n_outputs = n_outputs_new;
        }

        // find KV slot
        {
            if (!kv_self->find_slot(ubatch)) {
                LLAMA_LOG_WARN("%s: failed to find KV cache slot for ubatch of size %d\n", __func__, ubatch.n_tokens);

                return 1;
            }

            if (!kv_self->recurrent) {
                // a heuristic, to avoid attending the full cache if it is not yet utilized
                // after enough generations, the benefit from this heuristic disappears
                // if we start defragmenting the cache, the benefit from this will be more important
                const uint32_t pad = kv_self->get_padding(cparams);
                kv_self->n = std::min(kv_self->size, std::max(pad, GGML_PAD(kv_self->cell_max(), pad)));
            }
        }

        //printf("kv_self.n = %5d, kv_self.used = %5d, kv_self.head = %5d\n", kv_self->n, kv_self->used, kv_self->head);

        ggml_backend_sched_reset(sched.get());
        ggml_backend_sched_set_eval_callback(sched.get(), cparams.cb_eval, cparams.cb_eval_user_data);

        auto * gf = graph_init();
        auto res = graph_build(ctx_compute.get(), gf, ubatch, LLM_GRAPH_TYPE_DECODER);

        // LLAMA_LOG_INFO("graph build time: %.3f ms (%d nodes, %d leafs)\n", (ggml_time_us() - t_start_us)/1000.0, gf->n_nodes, gf->n_leafs);

        ggml_backend_sched_alloc_graph(sched.get(), gf);

        res->set_inputs(&ubatch);

        const auto compute_status = graph_compute(gf, ubatch.n_tokens > 1);
        if (compute_status != GGML_STATUS_SUCCESS) {
            switch (compute_status) {
                case GGML_STATUS_ABORTED:
                    return 2;
                case GGML_STATUS_ALLOC_FAILED:
                    return -2;
                case GGML_STATUS_FAILED:
                default:
                    return -3;
            }
        }

        // plot the computation graph in dot format (for debugging purposes)
        //if (n_past%100 == 0) {
        //    ggml_graph_dump_dot(gf, NULL, "llama.dot");
        //}

        auto * t_logits = cparams.embeddings ? nullptr         : res->get_logits();
        auto * t_embd   = cparams.embeddings ? res->get_embd() : nullptr;

        if (t_embd && res->get_embd_pooled()) {
            t_embd = res->get_embd_pooled();
        }

        // extract logits
        if (t_logits && n_outputs > 0) {
            ggml_backend_t backend_res = ggml_backend_sched_get_tensor_backend(sched.get(), t_logits);
            GGML_ASSERT(backend_res != nullptr);
            GGML_ASSERT(logits != nullptr);

            float * logits_out = logits + n_outputs_prev*n_vocab;

            if (n_outputs) {
                GGML_ASSERT( n_outputs_prev + n_outputs <= n_outputs_all);
                GGML_ASSERT((n_outputs_prev + n_outputs)*n_vocab <= (int64_t) logits_size);
                ggml_backend_tensor_get_async(backend_res, t_logits, logits_out, 0, n_outputs*n_vocab*sizeof(float));
            }
        }

        // extract embeddings
        if (t_embd && n_outputs > 0) {
            ggml_backend_t backend_embd = ggml_backend_sched_get_tensor_backend(sched.get(), t_embd);
            GGML_ASSERT(backend_embd != nullptr);

            switch (cparams.pooling_type) {
                case LLAMA_POOLING_TYPE_NONE:
                    {
                        // extract token embeddings
                        GGML_ASSERT(embd != nullptr);
                        float * embd_out = embd + n_outputs_prev*n_embd;

                        if (n_outputs) {
                            GGML_ASSERT( n_outputs_prev + n_outputs <= n_outputs_all);
                            GGML_ASSERT((n_outputs_prev + n_outputs)*n_embd <= (int64_t) embd_size);
                            ggml_backend_tensor_get_async(backend_embd, t_embd, embd_out, 0, n_outputs*n_embd*sizeof(float));
                        }
                    } break;
                case LLAMA_POOLING_TYPE_MEAN:
                case LLAMA_POOLING_TYPE_CLS:
                case LLAMA_POOLING_TYPE_LAST:
                    {
                        // extract sequence embeddings (cleared before processing each batch)
                        auto & embd_seq_out = embd_seq;

                        for (uint32_t s = 0; s < ubatch.n_seqs; ++s) {
                            const llama_seq_id seq_id = ubatch.seq_id[s][0];
                            if (embd_seq_out.find(seq_id) != embd_seq_out.end()) {
                                continue;
                            }
                            embd_seq_out[seq_id].resize(n_embd);
                            ggml_backend_tensor_get_async(backend_embd, t_embd, embd_seq_out[seq_id].data(), (n_embd*seq_id)*sizeof(float), n_embd*sizeof(float));
                        }
                    } break;
                case LLAMA_POOLING_TYPE_RANK:
                    {
                        // extract the rerank score - a single float per sequence
                        auto & embd_seq_out = embd_seq;

                        for (uint32_t s = 0; s < ubatch.n_seqs; ++s) {
                            const llama_seq_id seq_id = ubatch.seq_id[s][0];
                            if (embd_seq_out.find(seq_id) != embd_seq_out.end()) {
                                continue;
                            }
                            embd_seq_out[seq_id].resize(1);
                            ggml_backend_tensor_get_async(backend_embd, t_embd, embd_seq_out[seq_id].data(), (seq_id)*sizeof(float), sizeof(float));
                        }
                    } break;
                case LLAMA_POOLING_TYPE_UNSPECIFIED:
                    {
                        GGML_ABORT("unknown pooling type");
                    }
            }
        }

        n_outputs_prev += n_outputs;
    }

    // finalize the batch processing
    kv_guard.commit();

    // set output mappings
    {
        bool sorted_output = true;

        GGML_ASSERT(sbatch.out_ids.size() == (size_t) n_outputs_all);

        for (int64_t i = 0; i < n_outputs_all; ++i) {
            int64_t out_id = sbatch.out_ids[i];
            output_ids[out_id] = i;
            if (out_id != i) {
                sorted_output = false;
            }
        }

        if (sorted_output) {
            sbatch.out_ids.clear();
        }
    }

    // set to total number of outputs in the batch, for use in llama_get_logits_ith
    n_outputs = n_outputs_all;

    // wait for the computation to finish (automatically done when obtaining the model output)
    //synchronize();

    // decide if we need to defrag the kv cache
    if (cparams.causal_attn && cparams.defrag_thold > 0.0f) {
        // - do not defrag small contexts (i.e. < 2048 tokens)
        // - count the padding towards the number of used tokens
        const float fragmentation = kv_self->n >= 2048 ? std::max(0.0f, 1.0f - float(kv_self->used + kv_self->get_padding(cparams))/float(kv_self->n)) : 0.0f;

        // queue defragmentation for next llama_kv_cache_update
        if (fragmentation > cparams.defrag_thold) {
            LLAMA_LOG_DEBUG("%s: fragmentation: %.2f - requesting defrag\n", __func__, fragmentation);

            kv_self->defrag();
        }
    }

    // Reset state for the next token before backend sync, to allow the CPU activities in the reset to
    // overlap with device computation.
    ggml_backend_sched_reset(sched.get());

    return 0;
}